

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_part.c
# Opt level: O3

int cmime_part_from_string(CMimePart_T **part,char *content)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  char *in_RAX;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  char *local_38;
  char *dlb;
  
  if (*part == (CMimePart_T *)0x0) {
    __assert_fail("(*part)",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_part.c"
                  ,0x199,"int cmime_part_from_string(CMimePart_T **, const char *)");
  }
  if (content == (char *)0x0) {
    __assert_fail("content",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_part.c"
                  ,0x19a,"int cmime_part_from_string(CMimePart_T **, const char *)");
  }
  local_38 = in_RAX;
  pcVar4 = _cmime_internal_determine_linebreak(content);
  if (pcVar4 == (char *)0x0) {
    iVar3 = -1;
  }
  else {
    asprintf(&local_38,"%s%s",pcVar4,pcVar4);
    pcVar4 = local_38;
    pcVar5 = strstr(content,local_38);
    if (pcVar5 != (char *)0x0) {
      cVar2 = *content;
      while (cVar2 != '\0') {
        iVar3 = strncasecmp(content,"Content-Type:",0xd);
        if (iVar3 == 0) {
          content = content + 0xe;
          pcVar4 = _parse_header(content);
          cmime_part_set_content_type(*part,pcVar4);
          free(pcVar4);
        }
        iVar3 = strncasecmp(content,"Content-Transfer-Encoding:",0x1a);
        if (iVar3 == 0) {
          content = content + 0x1b;
          pcVar4 = _parse_header(content);
          cmime_part_set_content_transfer_encoding(*part,pcVar4);
          free(pcVar4);
        }
        iVar3 = strncasecmp(content,"Content-Disposition:",0x14);
        if (iVar3 == 0) {
          content = content + 0x15;
          pcVar4 = _parse_header(content);
          cmime_part_set_content_disposition(*part,pcVar4);
          free(pcVar4);
        }
        iVar3 = strncasecmp(content,"Content-ID:",0xb);
        if (iVar3 == 0) {
          content = content + 0xc;
          pcVar4 = _parse_header(content);
          cmime_part_set_content_id(*part,pcVar4);
          free(pcVar4);
        }
        pcVar4 = local_38;
        sVar6 = strlen(local_38);
        iVar3 = strncmp(content,pcVar4,sVar6);
        if (iVar3 == 0) break;
        pcVar1 = content + 1;
        content = content + 1;
        cVar2 = *pcVar1;
      }
      sVar6 = strlen(pcVar4);
      content = pcVar5 + sVar6;
    }
    pcVar4 = strdup(content);
    cmime_part_set_content(*part,pcVar4);
    free(pcVar4);
    free(local_38);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int cmime_part_from_string(CMimePart_T **part, const char *content) {
    char *ptemp = NULL;
    char *ptemp2 = NULL;
    char *body = NULL;
    char *lb = NULL;
    char *dlb;
    char *it = NULL;

    assert((*part));
    assert(content);
    
    lb = _cmime_internal_determine_linebreak(content);
    if (lb == NULL)
        return(-1);
    
    asprintf(&dlb,"%s%s",lb,lb);

    ptemp = strstr(content,dlb);
    if (ptemp != NULL) {
        it = (char *)content;
        while (*it != '\0') {
            if (strncasecmp(it,PART_CONTENT_TYPE_PATTERN,strlen(PART_CONTENT_TYPE_PATTERN))==0) {               
                it = it + sizeof(PART_CONTENT_TYPE_PATTERN);
                ptemp2 = _parse_header(it);         
                cmime_part_set_content_type((*part),ptemp2);
                free(ptemp2);
            }

            if (strncasecmp(it,PART_CONTENT_TRANSFER_ENCODING_PATTERN,strlen(PART_CONTENT_TRANSFER_ENCODING_PATTERN))==0) {
                it = it + sizeof(PART_CONTENT_TRANSFER_ENCODING_PATTERN);
                ptemp2 = _parse_header(it);
                cmime_part_set_content_transfer_encoding((*part),ptemp2);
                free(ptemp2);
            }
            
            if (strncasecmp(it,PART_CONTENT_DISPOSITION_PATTERN,strlen(PART_CONTENT_DISPOSITION_PATTERN))==0) {
                it = it + sizeof(PART_CONTENT_DISPOSITION_PATTERN);
                ptemp2 = _parse_header(it);
                cmime_part_set_content_disposition((*part),ptemp2);
                free(ptemp2);
            }   
                
            if (strncasecmp(it,PART_CONTENT_ID_PATTERN,strlen(PART_CONTENT_ID_PATTERN))==0) {
                it = it + sizeof(PART_CONTENT_ID_PATTERN);
                ptemp2 = _parse_header(it);
                cmime_part_set_content_id((*part),ptemp2);
                free(ptemp2);
            }   

            // break if body begins 
            if (strncmp(it,dlb,strlen(dlb))==0)
                break;
                
            it++;
        }
        
        ptemp += strlen(dlb);
        body = strdup(ptemp);
    } else {
        body = strdup(content);
    }
    
    cmime_part_set_content((*part),body);
    free(body);
    free(dlb);
    
    return(0);
}